

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetAssetIssuanceTest_multi_Test::TestBody
          (ConfidentialTransaction_SetAssetIssuanceTest_multi_Test *this)

{
  pointer *ppSVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  Amount AVar5;
  AssertHelper local_d50;
  Message local_d48 [2];
  CfdException *anon_var_0_5;
  byte local_cc1;
  char *pcStack_cc0;
  bool gtest_caught_expected_5;
  ConstCharPtr gtest_msg_5;
  Message local_cb0 [2];
  CfdException *anon_var_0_4;
  byte local_c29;
  char *pcStack_c28;
  bool gtest_caught_expected_4;
  ConstCharPtr gtest_msg_4;
  Message local_c18 [2];
  CfdException *anon_var_0_3;
  byte local_b91;
  char *pcStack_b90;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_b80 [2];
  CfdException *anon_var_0_2;
  byte local_af9;
  char *pcStack_af8;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_ae8 [2];
  CfdException *anon_var_0_1;
  byte local_a61;
  char *pcStack_a60;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_a50 [2];
  CfdException *anon_var_0;
  byte local_9c9;
  char *pcStack_9c8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_980;
  Message local_978;
  string local_970;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_3;
  Message local_938;
  string local_930;
  string local_910;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_2;
  Message local_8d8;
  IssuanceParameter local_8d0;
  allocator local_859;
  string local_858;
  undefined1 local_838 [8];
  ConfidentialNonce token_nonce2;
  ConfidentialNonce token_nonce1;
  string local_7e0;
  undefined1 local_7c0 [8];
  Script token_script2;
  string local_780;
  undefined1 local_760 [8];
  Script token_script1;
  undefined1 local_718 [8];
  Amount token_amount2;
  undefined1 local_6f8 [8];
  Amount token_amount1;
  string local_6e0;
  undefined1 local_6c0 [8];
  ConfidentialNonce asset_nonce2;
  ConfidentialNonce asset_nonce1;
  string local_668;
  undefined1 local_648 [8];
  Script asset_script2;
  string local_608;
  undefined1 local_5e8 [8];
  Script asset_script1;
  undefined1 local_5a0 [8];
  Amount asset_amount2;
  undefined1 local_580 [8];
  Amount asset_amount1;
  AssertHelper local_530;
  Message local_528;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  Message local_4e8;
  string local_4e0;
  string local_4c0;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar;
  Message local_488 [2];
  IssuanceParameter local_478;
  undefined1 local_408 [8];
  IssuanceParameter param;
  undefined1 local_390 [7];
  bool is_blind;
  ByteData256 contract_hash;
  ConfidentialNonce token_nonce;
  ConfidentialNonce asset_nonce;
  string local_320;
  undefined1 local_300 [8];
  Script token_script;
  string local_2c0;
  undefined1 local_2a0 [8];
  Script asset_script;
  undefined1 local_258 [8];
  Amount token_amount;
  undefined1 local_238 [8];
  Amount asset_amount;
  ConfidentialTransaction tx;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  token_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> token_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> token_amount_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_amount_list;
  string local_150;
  undefined1 local_130 [8];
  ConfidentialTransaction expect_tx2;
  string local_e8;
  undefined1 local_c8 [8];
  ConfidentialTransaction expect_tx1;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  ConfidentialTransaction tx_base;
  ConfidentialTransaction_SetAssetIssuanceTest_multi_Test *this_local;
  
  tx_base.vout_.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,&local_71);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)
              ((long)&expect_tx2.vout_.
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expect_tx2.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00060135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000001bf08eb00001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc01000000009502f90002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa160014144f003aa8dd6408ba0e8ee91757cf1f1976315c01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000017d78400001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000023c3460002d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590160014ae8cab151547d6f6e25b62b41200368dfdabe62b0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb53907700000000000000000000000000"
             ,(allocator *)
              ((long)&asset_amount_list.
                      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&asset_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount.ignore_check_,
             (ConfidentialTransaction *)local_50);
  AVar5 = cfd::core::Amount::CreateByCoinAmount(100.0);
  token_amount._8_8_ = AVar5.amount_;
  asset_amount.amount_._0_1_ = AVar5.ignore_check_;
  local_238 = (undefined1  [8])token_amount._8_8_;
  AVar5 = cfd::core::Amount::CreateByCoinAmount(10.0);
  asset_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar5.amount_;
  token_amount.amount_._0_1_ = AVar5.ignore_check_;
  local_258 = (undefined1  [8])
              asset_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,"76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac",
             (allocator *)
             ((long)&token_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_2a0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&token_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_320,"76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac",
             (allocator *)&asset_nonce.field_0x27);
  cfd::core::Script::Script((Script *)local_300,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&asset_nonce.field_0x27);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&token_nonce.version_);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)
             &contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_390);
  param.token._39_1_ = 0;
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)local_408);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                (&local_478,(ConfidentialTransaction *)&asset_amount.ignore_check_,0,
                 (Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_408,&local_478);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_478);
    }
  }
  else {
    testing::Message::Message(local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e3,
               "Expected: (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_488);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_4c0,(AbstractTransaction *)&asset_amount.ignore_check_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_4e0,(AbstractTransaction *)local_c8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4a0,"tx.GetHex().c_str()","expect_tx1.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar2) {
    testing::Message::Message(&local_4e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_520,(BlindFactor *)local_408);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_500,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",pcVar3,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_520);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar2) {
    testing::Message::Message(&local_528);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount1.ignore_check_,
             (ConfidentialTransaction *)local_50);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)&asset_amount.ignore_check_,
             (ConfidentialTransaction *)&asset_amount1.ignore_check_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount1.ignore_check_);
  AVar5 = cfd::core::Amount::CreateByCoinAmount(75.0);
  asset_amount2._8_8_ = AVar5.amount_;
  asset_amount1.amount_._0_1_ = AVar5.ignore_check_;
  local_580 = (undefined1  [8])asset_amount2._8_8_;
  AVar5 = cfd::core::Amount::CreateByCoinAmount(25.0);
  asset_script1.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar5.amount_;
  asset_amount2.amount_._0_1_ = AVar5.ignore_check_;
  local_5a0 = (undefined1  [8])
              asset_script1.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac",
             (allocator *)
             ((long)&asset_script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_5e8,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&asset_script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_668,"0014144f003aa8dd6408ba0e8ee91757cf1f1976315c",
             (allocator *)&asset_nonce1.field_0x27);
  cfd::core::Script::Script((Script *)local_648,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&asset_nonce1.field_0x27);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&asset_nonce2.version_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6e0,
             "02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa",
             (allocator *)&token_amount1.field_0xf);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_6c0,&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&token_amount1.field_0xf);
  AVar5 = cfd::core::Amount::CreateByCoinAmount(4.0);
  token_amount2._8_8_ = AVar5.amount_;
  token_amount1.amount_._0_1_ = AVar5.ignore_check_;
  local_6f8 = (undefined1  [8])token_amount2._8_8_;
  AVar5 = cfd::core::Amount::CreateByCoinAmount(6.0);
  token_script1.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar5.amount_;
  token_amount2.amount_._0_1_ = AVar5.ignore_check_;
  local_718 = (undefined1  [8])
              token_script1.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_780,"76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac",
             (allocator *)
             ((long)&token_script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_760,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&token_script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e0,"0014ae8cab151547d6f6e25b62b41200368dfdabe62b",
             (allocator *)&token_nonce1.field_0x27);
  cfd::core::Script::Script((Script *)local_7c0,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&token_nonce1.field_0x27);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&token_nonce2.version_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_858,
             "02d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590",&local_859);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_838,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_580);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_5e8);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &token_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(value_type *)&asset_nonce2.version_);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_5a0);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_648);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &token_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(value_type *)local_6c0);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_6f8);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_760);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&token_nonce2.version_
           );
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_718);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_7c0);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_838);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                (&local_8d0,(ConfidentialTransaction *)&asset_amount.ignore_check_,0,
                 (Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_408,&local_8d0);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_8d0);
    }
  }
  else {
    testing::Message::Message(&local_8d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x508,
               "Expected: (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_8d8);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_910,(AbstractTransaction *)&asset_amount.ignore_check_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_930,(AbstractTransaction *)local_130);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8f0,"tx.GetHex().c_str()","expect_tx2.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_910);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar2) {
    testing::Message::Message(&local_938);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x509,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_970,(BlindFactor *)local_408);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_950,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",pcVar3,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_970);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar2) {
    testing::Message::Message(&local_978);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x50c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg,(ConfidentialTransaction *)local_50);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)&asset_amount.ignore_check_,
             (ConfidentialTransaction *)&gtest_msg);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg);
  ppSVar1 = &asset_script_list.
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)ppSVar1);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)ppSVar1,
             (value_type *)local_238);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff638,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff638);
  if (bVar2) {
    local_9c9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0);
    }
    if ((local_9c9 & 1) == 0) {
      pcStack_9c8 = 
      "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046bcd8;
    }
  }
  else {
LAB_0046bcd8:
    testing::Message::Message(local_a50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x51c,pcStack_9c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_a50);
  }
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_5e8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff5a0,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff5a0);
  if (bVar2) {
    local_a61 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0_1,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0_1);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_1);
    }
    if ((local_a61 & 1) == 0) {
      pcStack_a60 = 
      "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046bf2f;
    }
  }
  else {
LAB_0046bf2f:
    testing::Message::Message(local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x523,pcStack_a60);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_ae8);
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_258);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff508,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff508);
  if (bVar2) {
    local_af9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0_2,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0_2);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_2);
    }
    if ((local_af9 & 1) == 0) {
      pcStack_af8 = 
      "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046c186;
    }
  }
  else {
LAB_0046c186:
    testing::Message::Message(local_b80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x52a,pcStack_af8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,local_b80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(local_b80);
  }
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_760);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff470,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff470);
  if (bVar2) {
    local_b91 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0_3,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0_3);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_3);
    }
    if ((local_b91 & 1) == 0) {
      pcStack_b90 = 
      "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046c3dd;
    }
  }
  else {
LAB_0046c3dd:
    testing::Message::Message(local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x531,pcStack_b90);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_4,local_c18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_4);
    testing::Message::~Message(local_c18);
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_580);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_5e8);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &token_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(value_type *)&asset_nonce2.version_);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff3d8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff3d8);
  if (bVar2) {
    local_c29 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0_4,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0_4);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_4);
    }
    if ((local_c29 & 1) == 0) {
      pcStack_c28 = 
      "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046c65e;
    }
  }
  else {
LAB_0046c65e:
    testing::Message::Message(local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x53d,pcStack_c28);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_5,local_cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_5);
    testing::Message::~Message(local_cb0);
  }
  ppSVar1 = &asset_script_list.
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)ppSVar1);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)ppSVar1,
             (value_type *)local_238);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_5e8);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &token_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(value_type *)&asset_nonce2.version_);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)local_6f8);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_760);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&token_nonce2.version_
           );
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff340,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff340);
  if (bVar2) {
    local_cc1 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                ((IssuanceParameter *)&anon_var_0_5,
                 (ConfidentialTransaction *)&asset_amount.ignore_check_,0,(Amount *)local_238,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &asset_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &asset_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&token_amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Amount *)local_258,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &token_script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &token_nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (bool)(param.token._39_1_ & 1),(ByteData256 *)local_390);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_408,(IssuanceParameter *)&anon_var_0_5);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_5);
    }
    if ((local_cc1 & 1) != 0) goto LAB_0046c9d7;
    pcStack_cc0 = 
    "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_d48);
  testing::internal::AssertHelper::AssertHelper
            (&local_d50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x54c,pcStack_cc0);
  testing::internal::AssertHelper::operator=(&local_d50,local_d48);
  testing::internal::AssertHelper::~AssertHelper(&local_d50);
  testing::Message::~Message(local_d48);
LAB_0046c9d7:
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_838);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&token_nonce2.version_);
  cfd::core::Script::~Script((Script *)local_7c0);
  cfd::core::Script::~Script((Script *)local_760);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_6c0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&asset_nonce2.version_);
  cfd::core::Script::~Script((Script *)local_648);
  cfd::core::Script::~Script((Script *)local_5e8);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)local_408);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_390);
  cfd::core::ConfidentialNonce::~ConfidentialNonce
            ((ConfidentialNonce *)
             &contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&token_nonce.version_);
  cfd::core::Script::~Script((Script *)local_300);
  cfd::core::Script::~Script((Script *)local_2a0);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&asset_amount.ignore_check_);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_130)
  ;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_c8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetIssuanceTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx1(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx2(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00060135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000001bf08eb00001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc01000000009502f90002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa160014144f003aa8dd6408ba0e8ee91757cf1f1976315c01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000017d78400001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000023c3460002d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590160014ae8cab151547d6f6e25b62b41200368dfdabe62b0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb53907700000000000000000000000000");

  std::vector<Amount> asset_amount_list;
  std::vector<Script> asset_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;
  std::vector<Amount> token_amount_list;
  std::vector<Script> token_script_list;
  std::vector<ConfidentialNonce> token_nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Script asset_script("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script token_script("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  ConfidentialNonce asset_nonce;
  ConfidentialNonce token_nonce;
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount asset_amount1 = Amount::CreateByCoinAmount(75.0);
  Amount asset_amount2 = Amount::CreateByCoinAmount(25.0);
  Script asset_script1("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script asset_script2("0014144f003aa8dd6408ba0e8ee91757cf1f1976315c");
  ConfidentialNonce asset_nonce1;
  ConfidentialNonce asset_nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  Amount token_amount1 = Amount::CreateByCoinAmount(4.0);
  Amount token_amount2 = Amount::CreateByCoinAmount(6.0);
  Script token_script1("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  Script token_script2("0014ae8cab151547d6f6e25b62b41200368dfdabe62b");
  ConfidentialNonce token_nonce1;
  ConfidentialNonce token_nonce2("02d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590");
  asset_amount_list.push_back(asset_amount1);
  asset_script_list.push_back(asset_script1);
  asset_nonce_list.push_back(asset_nonce1);
  asset_amount_list.push_back(asset_amount2);
  asset_script_list.push_back(asset_script2);
  asset_nonce_list.push_back(asset_nonce2);
  token_amount_list.push_back(token_amount1);
  token_script_list.push_back(token_script1);
  token_nonce_list.push_back(token_nonce1);
  token_amount_list.push_back(token_amount2);
  token_script_list.push_back(token_script2);
  token_nonce_list.push_back(token_nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
    asset_amount_list.push_back(asset_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.push_back(asset_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_script_list.clear();
    token_amount_list.push_back(token_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_amount_list.clear();
    token_script_list.push_back(token_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_script_list.clear();
  }
  // error (amount unmatch)
  {
    asset_amount_list.push_back(asset_amount1);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();

    asset_amount_list.push_back(asset_amount);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    token_amount_list.push_back(token_amount1);
    token_script_list.push_back(token_script1);
    token_nonce_list.push_back(token_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
  }
}